

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool ZeroKeyTest<unsigned_int>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  void *__s;
  long lVar2;
  int i;
  long lVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  
  printf("Keyset \'Zeroes\' - %d keys\n");
  __s = operator_new__(0x32000);
  memset(__s,0,0x32000);
  hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&hashes,0x32000);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 != 0x32000; lVar3 = lVar3 + 1) {
    (*hash)(__s,(int)lVar3,0,
            (void *)((long)hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar2));
    lVar2 = lVar2 + 4;
  }
  bVar1 = TestHashList<unsigned_int>(&hashes,drawDiagram,true,true,true,true);
  putchar(10);
  operator_delete__(__s);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&hashes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return bVar1;
}

Assistant:

bool ZeroKeyTest ( pfHash hash, bool drawDiagram )
{
  int keycount = 200*1024;

  printf("Keyset 'Zeroes' - %d keys\n",keycount);

  unsigned char * nullblock = new unsigned char[keycount];
  memset(nullblock,0,keycount);

  //----------

  std::vector<hashtype> hashes;

  hashes.resize(keycount);

  for(int i = 0; i < keycount; i++)
  {
    hash(nullblock,i,0,&hashes[i]);
  }

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);

  printf("\n");

  delete [] nullblock;

  return result;
}